

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O3

void threadMain(void *param)

{
  uint uVar1;
  uint uVar2;
  undefined8 in_RAX;
  ThreadParser *this;
  long lVar3;
  int fileNum;
  DOMDocument *node;
  double dVar4;
  
  if (gRunInfo.verbose) {
    printf("Thread #%d: starting\n",(ulong)*(uint *)((long)param + 8));
  }
  if (gRunInfo.stopNow == false) {
    this = (ThreadParser *)0x0;
    fileNum = gRunInfo.numInputFiles;
    do {
      if ((gRunInfo.numParses == 0) || (*(uint *)((long)param + 4) < gRunInfo.numParses)) {
        *(undefined1 *)((long)param + 1) = 1;
        if (this == (ThreadParser *)0x0) {
          this = (ThreadParser *)operator_new(0x40);
          ThreadParser::ThreadParser(this);
        }
        fileNum = fileNum + 1;
        if (gRunInfo.numInputFiles <= fileNum) {
          fileNum = 0;
        }
        if (gRunInfo.verbose == true) {
          printf("Thread #%d: parse %d starting file %s\n",(ulong)*(uint *)((long)param + 8),
                 (ulong)*(uint *)((long)param + 4),gRunInfo.files[fileNum].fileName);
        }
        uVar2 = ThreadParser::parse(this,fileNum);
        uVar1 = gRunInfo.files[fileNum].checkSum;
        if (uVar1 == 0) {
          gRunInfo.files[fileNum].checkSum = uVar2;
        }
        else if (uVar2 != uVar1) {
          if (uVar2 == 0) {
            uVar2 = this->fCheckSum;
          }
          fprintf(_stderr,
                  "\nThread %d: Parse Check sum error on file  \"%s\" for parse # %d.  Expected %x,  got %x\n"
                  ,(ulong)*(uint *)((long)param + 8),gRunInfo.files[fileNum].fileName,
                  (ulong)*(uint *)((long)param + 4),(ulong)uVar1,
                  CONCAT44((int)((ulong)in_RAX >> 0x20),uVar2));
          dVar4 = 0.0;
          if (0 < (long)gRunInfo.numThreads) {
            lVar3 = 0;
            do {
              dVar4 = dVar4 + (double)*(uint *)((long)&gThreadInfo->fParses + lVar3);
              lVar3 = lVar3 + 0xc;
            } while ((long)gRunInfo.numThreads * 0xc != lVar3);
          }
          fprintf(_stderr,"Total number of parses completed is %f.\n",dVar4);
          if (gRunInfo.dom == true) {
            this->fCheckSum = 0;
            node = this->fDoc + 0x18;
            if (this->fDoc == (DOMDocument *)0x0) {
              node = (DOMDocument *)0x0;
            }
            ThreadParser::domCheckSum(this,(DOMNode *)node);
          }
          fprintf(_stderr,"   Retry checksum is %x\n",(ulong)(uint)this->fCheckSum);
          if ((gRunInfo.dumpOnErr != false) && (gRunInfo.dom == true)) {
            ThreadParser::domPrint(this);
          }
          fflush(_stdout);
          fflush(_stderr);
          clearFileInfoMemory();
          exit(-1);
        }
        if (gRunInfo.reuseParser == false) {
          ThreadParser::~ThreadParser(this);
          operator_delete(this,0x40);
          this = (ThreadParser *)0x0;
        }
        *(undefined2 *)param = 1;
        *(int *)((long)param + 4) = *(int *)((long)param + 4) + 1;
      }
      else {
        sleep(1);
      }
    } while (gRunInfo.stopNow == false);
    if (this != (ThreadParser *)0x0) {
      ThreadParser::~ThreadParser(this);
      goto LAB_00105c5d;
    }
  }
  this = (ThreadParser *)0x0;
LAB_00105c5d:
  operator_delete(this,0x40);
  return;
}

Assistant:

unsigned long WINAPI threadMain (void *param)
#endif
{
    ThreadInfo   *thInfo = (ThreadInfo *)param;
    ThreadParser *thParser = 0;

    if (gRunInfo.verbose)
        printf("Thread #%d: starting\n", thInfo->fThreadNum);

    int docNum = gRunInfo.numInputFiles;

    //
    // Each time through this loop, one file will be parsed and its checksum
    // computed and compared with the precomputed value for that file.
    //
    while (gRunInfo.stopNow == false) {
        if (gRunInfo.numParses == 0 || thInfo->fParses < gRunInfo.numParses) {
            thInfo->fInProgress = true;

            if (thParser == 0)
                thParser = new ThreadParser;

            docNum++;

            if (docNum >= gRunInfo.numInputFiles)
                docNum = 0;

            InFileInfo *fInfo = &gRunInfo.files[docNum];

            if (gRunInfo.verbose )
                printf("Thread #%d: parse %d starting file %s\n", thInfo->fThreadNum, thInfo->fParses, fInfo->fileName);

            int checkSum = 0;

            checkSum = thParser->parse(docNum);

            // For the case where we skip the preparse we will have nothing to
            // compare the first parse's results to ... so if this looks like first
            // parse move the checkSum back into the gRunInfo data for this file.

            if (gRunInfo.files[docNum].checkSum == 0) {
                gRunInfo.files[docNum].checkSum = checkSum;
            }
            else if (checkSum != gRunInfo.files[docNum].checkSum) {
                if (checkSum == 0) {
                    // parse returns 0 if there was an error so do this to get the real
                    // checksum value
                    checkSum = thParser->getCheckSum();
                }
                fprintf(stderr, "\nThread %d: Parse Check sum error on file  \"%s\" for parse # %d.  Expected %x,  got %x\n",
                    thInfo->fThreadNum, fInfo->fileName, thInfo->fParses, fInfo->checkSum, checkSum);

	            double totalParsesCompleted = 0;
                for (int threadNum=0; threadNum < gRunInfo.numThreads; threadNum++) {
                    totalParsesCompleted += gThreadInfo[threadNum].fParses;
                }
                fprintf(stderr, "Total number of parses completed is %f.\n", totalParsesCompleted);

                // Revisit - let the loop continue to run?
                int secondTryCheckSum = thParser->reCheck();
                fprintf(stderr, "   Retry checksum is %x\n", secondTryCheckSum);
                if (gRunInfo.dumpOnErr && gRunInfo.dom) {
                    thParser->domPrint();
                }
                fflush(stdout);
                fflush(stderr);
                clearFileInfoMemory();
                exit(-1);
            }

            if (gRunInfo.reuseParser == false) {
                delete thParser;
                thParser = 0;
            }

            thInfo->fHeartBeat = true;
            thInfo->fParses++;
            thInfo->fInProgress = false;
        }
        else {
            ThreadFuncs::Sleep(1000);
        }
    }
    delete thParser;
#ifdef HAVE_PTHREAD
	return;
}
#else
    return 0;
#endif
}